

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O1

void __thiscall
TRM::BitmapDevice::Triangle
          (BitmapDevice *this,Vec2i *a,Vec2i *b,Vec2i *c,Color *ca,Color *cb,Color *cc)

{
  Vec3f c3f;
  Vec3f b3f;
  Vec3f a3f;
  
  (*(this->super_Device)._vptr_Device[5])();
  return;
}

Assistant:

void BitmapDevice::Triangle(const Vec2i& a, Vec2i const& b, Vec2i const& c,
                            Color const& ca, Color const& cb, Color const& cc) {
  Vec3f a3f{a.x, a.y, 0.f};
  Vec3f b3f{b.x, b.y, 0.f};
  Vec3f c3f{c.x, c.y, 0.f};

  Triangle(a3f, b3f, c3f, ca, cb, cc);
}